

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O2

JsErrorCode
JsVarSerializer(ReallocateBufferMemoryFunc reallocateBufferMemory,
               WriteHostObjectFunc writeHostObject,void *callbackState,
               JsVarSerializerHandle *serializerHandle)

{
  ScriptContext *pSVar1;
  JsErrorCode JVar2;
  JsrtContext *currentContext;
  HeapAllocator *pHVar3;
  ChakraCoreStreamWriter *this;
  Serializer *s;
  undefined1 local_90 [8];
  TrackAllocData data;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  JVar2 = JsErrorNullArgument;
  if (serializerHandle != (JsVarSerializerHandle *)0x0 &&
      (writeHostObject != (WriteHostObjectFunc)0x0 &&
      reallocateBufferMemory != (ReallocateBufferMemoryFunc)0x0)) {
    currentContext = JsrtContext::GetCurrent();
    JVar2 = CheckContext(currentContext,false,false);
    if (JVar2 == JsNoError) {
      pSVar1 = (((currentContext->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
               scriptContext.ptr;
      AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                ((AutoNestedHandledExceptionType *)&data.line,
                 ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
      local_90 = (undefined1  [8])&ChakraCoreStreamWriter::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_695a4b;
      data.filename._0_4_ = 0x123;
      pHVar3 = Memory::HeapAllocator::TrackAllocInfo
                         (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_90);
      this = (ChakraCoreStreamWriter *)new<Memory::HeapAllocator>(0x38,pHVar3,0x2f6726);
      (this->super_HostStream)._vptr_HostStream = (_func_int **)&PTR_ExtendBuffer_0136d850;
      this->m_serializerCore = (Serializer *)0x0;
      this->m_data = (byte *)0x0;
      this->m_length = 0;
      this->reallocateBufferMemory = reallocateBufferMemory;
      this->writeHostObject = writeHostObject;
      this->callbackState = callbackState;
      local_90 = (undefined1  [8])&Js::SCACore::Serializer::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_695a4b;
      data.filename._0_4_ = 0x124;
      pHVar3 = Memory::HeapAllocator::TrackAllocInfo
                         (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_90);
      s = (Serializer *)new<Memory::HeapAllocator>(0x38,pHVar3,0x2f6726);
      (s->m_streamWriter).super_ScriptContextHolder.m_scriptContext = pSVar1;
      (s->m_streamWriter).m_stream = (HostStream *)this;
      (s->m_streamWriter).m_buffer = (byte *)0x0;
      (s->m_streamWriter).m_current = 0;
      (s->m_streamWriter).m_capacity = 0;
      s->m_transferableVars = (Var *)0x0;
      s->m_cTransferableVars = 0;
      ChakraCoreStreamWriter::SetSerializer(this,s);
      *serializerHandle = this;
      AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
                ((AutoNestedHandledExceptionType *)&data.line);
      JVar2 = JsNoError;
    }
  }
  return JVar2;
}

Assistant:

CHAKRA_API
JsVarSerializer(
    _In_ ReallocateBufferMemoryFunc reallocateBufferMemory,
    _In_ WriteHostObjectFunc writeHostObject,
    _In_opt_ void * callbackState,
    _Out_ JsVarSerializerHandle *serializerHandle)
{
    PARAM_NOT_NULL(reallocateBufferMemory);
    PARAM_NOT_NULL(writeHostObject);
    PARAM_NOT_NULL(serializerHandle);
    JsErrorCode errorCode = ContextAPINoScriptWrapper_NoRecord([&](Js::ScriptContext *scriptContext) -> JsErrorCode {

        ChakraCoreStreamWriter *writer = HeapNew(ChakraCoreStreamWriter, reallocateBufferMemory, writeHostObject, callbackState);
        writer->SetSerializer(HeapNew(Js::SCACore::Serializer, scriptContext, writer));
        *serializerHandle = writer;
        return JsNoError;
    });

    return errorCode;

}